

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O3

Flow * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::visitStructNew
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,StructNew *curr)

{
  ulong uVar1;
  Flow *pFVar2;
  pointer pLVar3;
  element_type *peVar4;
  Literal *pLVar5;
  undefined8 uVar6;
  ulong uVar7;
  Type this_00;
  HeapType heapType;
  HeapType local_e8 [3];
  Literal local_d0;
  undefined1 local_b8 [8];
  Literals data;
  GCData *local_70;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_68;
  Literal *local_60;
  vector<wasm::Literal,_std::allocator<wasm::Literal>_> *local_58;
  ExpressionRunner<wasm::ModuleRunner> *local_50;
  Flow *local_48;
  size_t local_40;
  undefined1 local_31;
  
  local_50 = this;
  local_48 = __return_storage_ptr__;
  if ((curr->super_SpecificExpression<(wasm::Expression::Id)60>).super_Expression.type.id == 1) {
    local_40 = (curr->operands).
               super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
               usedElements;
    if (local_40 != 0) {
      uVar7 = 0;
      do {
        pFVar2 = local_48;
        if ((curr->operands).
            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements
            <= uVar7) goto LAB_0018ef4e;
        visit(local_48,local_50,
              (curr->operands).
              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data[uVar7]
             );
        if ((pFVar2->breakTo).super_IString.str._M_str != (char *)0x0) {
          return local_48;
        }
        std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
                  (&(__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible)
        ;
        ::wasm::Literal::~Literal
                  ((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed.
                   _M_elems);
        uVar7 = uVar7 + 1;
      } while (local_40 != uVar7);
    }
    ::wasm::handle_unreachable
              ("unreachable but no unreachable child",
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-interpreter.h"
               ,0x602);
  }
  ::wasm::Type::getHeapType();
  pLVar3 = (pointer)::wasm::HeapType::getStruct();
  SmallVector<wasm::Literal,_1UL>::SmallVector
            ((SmallVector<wasm::Literal,_1UL> *)local_b8,
             (long)(pLVar3->field_0).gcData.
                   super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi -
             (pLVar3->field_0).i64 >> 4);
  peVar4 = (pLVar3->field_0).gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  data.super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pLVar3;
  if ((element_type *)(pLVar3->field_0).func.super_IString.str._M_str != peVar4) {
    local_58 = &(local_48->values).super_SmallVector<wasm::Literal,_1UL>.flexible;
    local_60 = (local_48->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems;
    local_40 = CONCAT44(local_40._4_4_,1);
    uVar7 = 0;
    do {
      pFVar2 = local_48;
      uVar1 = (curr->operands).
              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
              usedElements;
      if (uVar1 == 0) {
        ::wasm::Literal::makeZero((Type)local_e8);
        pLVar5 = (Literal *)
                 ((data.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id - 0x18) +
                 uVar7 * 0x18);
        if ((int)local_40 == 1) {
          pLVar5 = (Literal *)&data;
        }
        ::wasm::Literal::operator=(pLVar5,(Literal *)local_e8);
        this_00.id = (uintptr_t)local_e8;
      }
      else {
        if (uVar1 <= uVar7) {
LAB_0018ef4e:
          __assert_fail("index < usedElements",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/mixed_arena.h"
                        ,0xbc,
                        "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                       );
        }
        visit(local_48,local_50,
              (curr->operands).
              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data[uVar7]
             );
        if ((pFVar2->breakTo).super_IString.str._M_str != (char *)0x0) goto LAB_0018ef20;
        pLVar5 = Flow::getSingleValue(pFVar2);
        ::wasm::Literal::Literal((Literal *)&heapType,pLVar5);
        truncateForPacking((Literal *)local_e8,local_50,(Literal *)&heapType,
                           (Field *)((long)(peVar4->values).super_SmallVector<wasm::Literal,_1UL>.
                                           fixed._M_elems + uVar7 * 0x10 + 0xfffffffffffffff0));
        pLVar5 = (Literal *)
                 ((data.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id - 0x18) +
                 uVar7 * 0x18);
        if ((int)local_40 == 1) {
          pLVar5 = (Literal *)&data;
        }
        ::wasm::Literal::operator=(pLVar5,(Literal *)local_e8);
        ::wasm::Literal::~Literal((Literal *)local_e8);
        ::wasm::Literal::~Literal((Literal *)&heapType);
        std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector(local_58);
        this_00.id = (uintptr_t)local_60;
      }
      ::wasm::Literal::~Literal((Literal *)this_00.id);
      uVar7 = local_40 & 0xffffffff;
      peVar4 = (element_type *)
               ((data.super_SmallVector<wasm::Literal,_1UL>.flexible.
                 super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage)->field_0).i64;
      local_40 = CONCAT44(local_40._4_4_,(int)local_40 + 1);
    } while (uVar7 < (ulong)((long)((data.super_SmallVector<wasm::Literal,_1UL>.flexible.
                                     super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->field_0).
                                   gcData.
                                   super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount._M_pi - (long)peVar4 >> 4));
  }
  local_e8[0].id = ::wasm::Type::getHeapType();
  local_70 = (GCData *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<wasm::GCData,std::allocator<wasm::GCData>,wasm::HeapType,wasm::Literals&>
            (&local_68,&local_70,(allocator<wasm::GCData> *)&local_31,local_e8,(Literals *)local_b8)
  ;
  uVar6 = ::wasm::Type::getHeapType();
  pFVar2 = local_48;
  ::wasm::Literal::Literal(&local_d0,&local_70,uVar6);
  Flow::Flow(pFVar2,&local_d0);
  ::wasm::Literal::~Literal(&local_d0);
  if (local_68._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68._M_pi);
  }
LAB_0018ef20:
  std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
            ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
             &data.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
  ::wasm::Literal::~Literal((Literal *)&data);
  return local_48;
}

Assistant:

Flow visitStructNew(StructNew* curr) {
    NOTE_ENTER("StructNew");
    if (curr->type == Type::unreachable) {
      // We cannot proceed to compute the heap type, as there isn't one. Just
      // find why we are unreachable, and stop there.
      for (auto* operand : curr->operands) {
        auto value = self()->visit(operand);
        if (value.breaking()) {
          return value;
        }
      }
      WASM_UNREACHABLE("unreachable but no unreachable child");
    }
    auto heapType = curr->type.getHeapType();
    const auto& fields = heapType.getStruct().fields;
    Literals data(fields.size());
    for (Index i = 0; i < fields.size(); i++) {
      auto& field = fields[i];
      if (curr->isWithDefault()) {
        data[i] = Literal::makeZero(field.type);
      } else {
        auto value = self()->visit(curr->operands[i]);
        if (value.breaking()) {
          return value;
        }
        data[i] = truncateForPacking(value.getSingleValue(), field);
      }
    }
    return Literal(std::make_shared<GCData>(curr->type.getHeapType(), data),
                   curr->type.getHeapType());
  }